

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

value_type * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::FindAndConstruct(DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *this,unsigned_long *Key)

{
  bool bVar1;
  DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *TheBucket;
  DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *local_20
  ;
  
  bVar1 = LookupBucketFor<unsigned_long>(this,Key,&local_20);
  if (!bVar1) {
    local_20 = DenseMapBase<llvm::DenseMap<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::InsertIntoBucket<unsigned_long_const&>
                         ((DenseMapBase<llvm::DenseMap<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)this,local_20,Key);
  }
  return local_20;
}

Assistant:

value_type& FindAndConstruct(const KeyT &Key) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return *TheBucket;

    return *InsertIntoBucket(TheBucket, Key);
  }